

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

int __thiscall TPZFMatrix<long_double>::Decompose_Cholesky(TPZFMatrix<long_double> *this)

{
  long *plVar1;
  int iVar2;
  long *plVar3;
  list<long,_std::allocator<long>_> fake;
  long *local_38;
  undefined1 *local_30;
  long local_28;
  
  local_30 = (undefined1 *)&local_38;
  local_38 = (long *)&local_38;
  local_28 = 0;
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x18])(this,&local_38);
  if (local_28 != 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.cpp"
               ,0x647);
  }
  plVar3 = local_38;
  if ((long **)local_38 != &local_38) {
    do {
      plVar1 = (long *)*plVar3;
      operator_delete(plVar3,0x18);
      plVar3 = plVar1;
    } while ((long **)plVar1 != &local_38);
  }
  return iVar2;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_Cholesky(){
    std::list<int64_t> fake;
    int res = this->Decompose_Cholesky(fake);
    if(fake.size()){
        DebugStop();
    }
    return res;
}